

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::findCommonAncestor
          (ChainImpl *this,uint256 *block_hash1,uint256 *block_hash2,FoundBlock *ancestor_out,
          FoundBlock *block1_out,FoundBlock *block2_out)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ChainstateManager *pCVar4;
  Chainstate *pCVar5;
  CBlockIndex *pa;
  CBlockIndex *pb;
  CBlockIndex *index;
  CChain *active;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lock;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x26e,false);
  pCVar4 = chainman(this);
  pCVar5 = ChainstateManager::ActiveChainstate(pCVar4);
  pCVar4 = chainman(this);
  pa = BlockManager::LookupBlockIndex(&pCVar4->m_blockman,block_hash1);
  pCVar4 = chainman(this);
  pb = BlockManager::LookupBlockIndex(&pCVar4->m_blockman,block_hash2);
  if (pb == (CBlockIndex *)0x0 || pa == (CBlockIndex *)0x0) {
    index = (CBlockIndex *)0x0;
  }
  else {
    index = LastCommonAncestor(pa,pb);
  }
  pCVar4 = chainman(this);
  active = &pCVar5->m_chain;
  bVar1 = FillBlock(index,ancestor_out,
                    (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,active,
                    &pCVar4->m_blockman);
  pCVar4 = chainman(this);
  bVar2 = FillBlock(pa,block1_out,(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,
                    active,&pCVar4->m_blockman);
  pCVar4 = chainman(this);
  bVar3 = FillBlock(pb,block2_out,(UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_48,
                    active,&pCVar4->m_blockman);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bVar1 && bVar2) && bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool findCommonAncestor(const uint256& block_hash1, const uint256& block_hash2, const FoundBlock& ancestor_out, const FoundBlock& block1_out, const FoundBlock& block2_out) override
    {
        WAIT_LOCK(cs_main, lock);
        const CChain& active = chainman().ActiveChain();
        const CBlockIndex* block1 = chainman().m_blockman.LookupBlockIndex(block_hash1);
        const CBlockIndex* block2 = chainman().m_blockman.LookupBlockIndex(block_hash2);
        const CBlockIndex* ancestor = block1 && block2 ? LastCommonAncestor(block1, block2) : nullptr;
        // Using & instead of && below to avoid short circuiting and leaving
        // output uninitialized. Cast bool to int to avoid -Wbitwise-instead-of-logical
        // compiler warnings.
        return int{FillBlock(ancestor, ancestor_out, lock, active, chainman().m_blockman)} &
               int{FillBlock(block1, block1_out, lock, active, chainman().m_blockman)} &
               int{FillBlock(block2, block2_out, lock, active, chainman().m_blockman)};
    }